

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.cc
# Opt level: O0

void __thiscall
prometheus::detail::MetricsHandler::MetricsHandler(MetricsHandler *this,Registry *registry)

{
  initializer_list<prometheus::detail::CKMSQuantiles::Quantile> __l;
  Builder<prometheus::Counter> *pBVar1;
  Family<prometheus::Counter> *pFVar2;
  Counter *pCVar3;
  Builder<prometheus::Summary> *pBVar4;
  Family<prometheus::Summary> *pFVar5;
  Summary *pSVar6;
  allocator<prometheus::detail::CKMSQuantiles::Quantile> local_381;
  Quantile local_380;
  Quantile local_360;
  Quantile local_340;
  iterator local_320;
  size_type local_318;
  vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
  local_310;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2f8;
  allocator local_2c1;
  string local_2c0;
  allocator local_299;
  string local_298;
  Builder<prometheus::Summary> local_278;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_208;
  allocator local_1d1;
  string local_1d0;
  allocator local_1a9;
  string local_1a8;
  Builder<prometheus::Counter> local_188;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_118;
  allocator local_e1;
  string local_e0;
  allocator local_b9;
  string local_b8;
  Builder<prometheus::Counter> local_88;
  Registry *local_18;
  Registry *registry_local;
  MetricsHandler *this_local;
  
  local_18 = registry;
  registry_local = (Registry *)this;
  CivetHandler::CivetHandler(&this->super_CivetHandler);
  (this->super_CivetHandler)._vptr_CivetHandler = (_func_int **)&PTR__MetricsHandler_002305b8;
  std::mutex::mutex(&this->collectables_mutex_);
  std::
  vector<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
  ::vector(&this->collectables_);
  BuildCounter();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"exposer_transferred_bytes_total",&local_b9);
  pBVar1 = Builder<prometheus::Counter>::Name(&local_88,&local_b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_e0,"Transferred bytes to metrics services",&local_e1);
  pBVar1 = Builder<prometheus::Counter>::Help(pBVar1,&local_e0);
  pFVar2 = Builder<prometheus::Counter>::Register(pBVar1,local_18);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  Builder<prometheus::Counter>::~Builder(&local_88);
  this->bytes_transferred_family_ = pFVar2;
  pFVar2 = this->bytes_transferred_family_;
  local_118._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_118._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_118._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_118._M_t._M_impl._0_8_ = 0;
  local_118._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_118._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&local_118);
  pCVar3 = Family<prometheus::Counter>::Add<>(pFVar2,&local_118);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&local_118);
  this->bytes_transferred_ = pCVar3;
  BuildCounter();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a8,"exposer_scrapes_total",&local_1a9);
  pBVar1 = Builder<prometheus::Counter>::Name(&local_188,&local_1a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1d0,"Number of times metrics were scraped",&local_1d1);
  pBVar1 = Builder<prometheus::Counter>::Help(pBVar1,&local_1d0);
  pFVar2 = Builder<prometheus::Counter>::Register(pBVar1,local_18);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  Builder<prometheus::Counter>::~Builder(&local_188);
  this->num_scrapes_family_ = pFVar2;
  pFVar2 = this->num_scrapes_family_;
  local_208._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_208._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_208._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_208._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_208._M_t._M_impl._0_8_ = 0;
  local_208._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_208._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&local_208);
  pCVar3 = Family<prometheus::Counter>::Add<>(pFVar2,&local_208);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&local_208);
  this->num_scrapes_ = pCVar3;
  BuildSummary();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_298,"exposer_request_latencies",&local_299);
  pBVar4 = Builder<prometheus::Summary>::Name(&local_278,&local_298);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2c0,"Latencies of serving scrape requests, in microseconds",&local_2c1
            );
  pBVar4 = Builder<prometheus::Summary>::Help(pBVar4,&local_2c0);
  pFVar5 = Builder<prometheus::Summary>::Register(pBVar4,local_18);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  Builder<prometheus::Summary>::~Builder(&local_278);
  this->request_latencies_family_ = pFVar5;
  pFVar5 = this->request_latencies_family_;
  local_2f8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_2f8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2f8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2f8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_2f8._M_t._M_impl._0_8_ = 0;
  local_2f8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2f8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&local_2f8);
  CKMSQuantiles::Quantile::Quantile(&local_380,0.5,0.05);
  CKMSQuantiles::Quantile::Quantile(&local_360,0.9,0.01);
  CKMSQuantiles::Quantile::Quantile(&local_340,0.99,0.001);
  local_320 = &local_380;
  local_318 = 3;
  std::allocator<prometheus::detail::CKMSQuantiles::Quantile>::allocator(&local_381);
  __l._M_len = local_318;
  __l._M_array = local_320;
  std::
  vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
  ::vector(&local_310,__l,&local_381);
  pSVar6 = Family<prometheus::Summary>::
           Add<std::vector<prometheus::detail::CKMSQuantiles::Quantile,std::allocator<prometheus::detail::CKMSQuantiles::Quantile>>>
                     (pFVar5,&local_2f8,&local_310);
  std::
  vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
  ::~vector(&local_310);
  std::allocator<prometheus::detail::CKMSQuantiles::Quantile>::~allocator(&local_381);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&local_2f8);
  this->request_latencies_ = pSVar6;
  return;
}

Assistant:

MetricsHandler::MetricsHandler(Registry& registry)
    : bytes_transferred_family_(
          BuildCounter()
              .Name("exposer_transferred_bytes_total")
              .Help("Transferred bytes to metrics services")
              .Register(registry)),
      bytes_transferred_(bytes_transferred_family_.Add({})),
      num_scrapes_family_(BuildCounter()
                              .Name("exposer_scrapes_total")
                              .Help("Number of times metrics were scraped")
                              .Register(registry)),
      num_scrapes_(num_scrapes_family_.Add({})),
      request_latencies_family_(
          BuildSummary()
              .Name("exposer_request_latencies")
              .Help("Latencies of serving scrape requests, in microseconds")
              .Register(registry)),
      request_latencies_(request_latencies_family_.Add(
          {}, Summary::Quantiles{{0.5, 0.05}, {0.9, 0.01}, {0.99, 0.001}})) {}